

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

uint32_t pkt_buf_alloc_batch(mempool *mempool,pkt_buf **bufs,uint32_t num_bufs)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)num_bufs;
  if (mempool->free_stack_top < num_bufs) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
            "pkt_buf_alloc_batch",mempool,(ulong)mempool->free_stack_top,uVar5);
    uVar5 = (ulong)mempool->free_stack_top;
  }
  if ((uint32_t)uVar5 != 0) {
    uVar1 = mempool->buf_size;
    uVar3 = (ulong)mempool->free_stack_top;
    lVar4 = 0;
    do {
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
      *(ulong *)((long)bufs + lVar4) =
           (ulong)(*(int *)(&mempool->field_0x14 + uVar3 * 4) * uVar1) + (long)mempool->base_addr;
      lVar4 = lVar4 + 8;
    } while (uVar5 << 3 != lVar4);
    mempool->free_stack_top = uVar2;
  }
  return (uint32_t)uVar5;
}

Assistant:

uint32_t pkt_buf_alloc_batch(struct mempool* mempool, struct pkt_buf* bufs[], uint32_t num_bufs) {
	if (mempool->free_stack_top < num_bufs) {
		warn("memory pool %p only has %d free bufs, requested %d", mempool, mempool->free_stack_top, num_bufs);
		num_bufs = mempool->free_stack_top;
	}
	for (uint32_t i = 0; i < num_bufs; i++) {
		uint32_t entry_id = mempool->free_stack[--mempool->free_stack_top];
		bufs[i] = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + entry_id * mempool->buf_size);
	}
	return num_bufs;
}